

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
array<CLayer_*,_allocator_default<CLayer_*>_>::remove
          (array<CLayer_*,_allocator_default<CLayer_*>_> *this,char *__filename)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  undefined8 unaff_RBX;
  ulong uVar5;
  ulong uVar6;
  undefined7 uVar4;
  
  uVar2 = (ulong)this->num_elements;
  uVar4 = (undefined7)((ulong)unaff_RBX >> 8);
  iVar3 = (int)CONCAT71(uVar4,0 < (long)uVar2);
  if (0 < (long)uVar2) {
    if (*this->list == *(CLayer **)__filename) {
      uVar5 = 0;
    }
    else {
      uVar6 = 0;
      do {
        if (uVar2 - 1 == uVar6) {
          return (int)CONCAT71(uVar4,uVar6 + 1 < uVar2);
        }
        uVar5 = uVar6 + 1;
        lVar1 = uVar6 + 1;
        uVar6 = uVar5;
      } while (this->list[lVar1] != *(CLayer **)__filename);
      iVar3 = (int)CONCAT71(uVar4,uVar5 < uVar2);
    }
    remove_index(this,(int)uVar5);
  }
  return iVar3;
}

Assistant:

bool remove(const T& item)
	{
		for(int i = 0; i < size(); i++)
			if(list[i] == item)
			{
				remove_index(i);
				return true;
			}
		return false;
	}